

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

bool __thiscall
S2Builder::EdgeChainSimplifier::AvoidSites
          (EdgeChainSimplifier *this,VertexId v0,VertexId v1,VertexId v2,
          S2PolylineSimplifier *simplifier)

{
  S2Point *y;
  pointer pVVar1;
  S2Builder *pSVar2;
  pointer piVar3;
  pointer pcVar4;
  S2PolylineSimplifier *this_00;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppVar8;
  int iVar9;
  ulong uVar10;
  EdgeId e;
  long lVar11;
  S2Point *pSVar12;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar13;
  uint uVar14;
  pair<const_std::pair<int,_int>_*,_const_std::pair<int,_int>_*> pVar15;
  S1ChordAngle r;
  S1ChordAngle r2;
  S1ChordAngle r1;
  IdSet local_80;
  S2PolylineSimplifier *local_68;
  S2Point *local_60;
  S2Point *local_58;
  S2Point *local_50;
  long local_48;
  S1ChordAngle local_40;
  S1ChordAngle local_38;
  
  pVVar1 = (this->g_->vertices_->
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar12 = pVVar1 + v0;
  local_58 = pVVar1 + v1;
  local_48 = (long)v2;
  y = pVVar1 + local_48;
  local_68 = simplifier;
  S1ChordAngle::S1ChordAngle(&local_38,pSVar12,local_58);
  local_60 = y;
  local_50 = pSVar12;
  S1ChordAngle::S1ChordAngle(&local_40,pSVar12,y);
  if ((local_40.length2_ < local_38.length2_) ||
     (pSVar2 = this->builder_, (pSVar2->min_edge_length_to_split_ca_).length2_ <= local_40.length2_)
     ) {
LAB_001ad574:
    bVar5 = false;
  }
  else {
    piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar8 = (((this->out_).edges_)->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    local_80.begin_._0_4_ = v1;
    local_80.begin_._4_4_ = v2;
    pVar15 = std::
             __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                       (ppVar8 + piVar3[v1],ppVar8 + piVar3[(long)v1 + 1]);
    ppVar8 = (((this->out_).edges_)->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    uVar14 = 0xffffffff;
    iVar6 = (int)((ulong)((long)pVar15.first - (long)ppVar8) >> 3);
    iVar9 = (int)((ulong)((long)pVar15.second - (long)ppVar8) >> 3);
    if (iVar6 != iVar9) {
      lVar11 = (long)iVar6;
      do {
        IdSetLexicon::id_set
                  (&local_80,this->g_->input_edge_id_set_lexicon_,
                   (this->g_->input_edge_id_set_ids_->super__Vector_base<int,_std::allocator<int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar11]);
        for (poVar7 = (ostream *)CONCAT44(local_80.begin_._4_4_,(VertexId)local_80.begin_);
            poVar7 != (ostream *)local_80.end_;
            poVar7 = (ostream *)((long)&poVar7->_vptr_basic_ostream + 4)) {
          if (((int)uVar14 < 0) ||
             (pcVar4 = (pSVar2->edge_sites_).
                       super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (*(uint *)&pcVar4[(int)*(uint *)&poVar7->_vptr_basic_ostream].
                        super_compact_array_base<int,_std::allocator<int>_> & 0xffffff) <
             (*(uint *)&pcVar4[uVar14].super_compact_array_base<int,_std::allocator<int>_> &
             0xffffff))) {
            uVar14 = *(uint *)&poVar7->_vptr_basic_ostream;
          }
        }
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != iVar9);
      ppVar8 = (((this->out_).edges_)->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    }
    piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_80.begin_._0_4_ = v2;
    local_80.begin_._4_4_ = v1;
    pVar15 = std::
             __equal_range<std::pair<int,int>const*,std::pair<int,int>,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                       (ppVar8 + piVar3[local_48],ppVar8 + piVar3[local_48 + 1]);
    ppVar8 = (((this->out_).edges_)->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    iVar6 = (int)((ulong)((long)pVar15.first - (long)ppVar8) >> 3);
    iVar9 = (int)((ulong)((long)pVar15.second - (long)ppVar8) >> 3);
    if (iVar6 != iVar9) {
      lVar11 = (long)iVar6;
      do {
        IdSetLexicon::id_set
                  (&local_80,this->g_->input_edge_id_set_lexicon_,
                   (this->g_->input_edge_id_set_ids_->super__Vector_base<int,_std::allocator<int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar11]);
        for (poVar7 = (ostream *)CONCAT44(local_80.begin_._4_4_,(VertexId)local_80.begin_);
            poVar7 != (ostream *)local_80.end_;
            poVar7 = (ostream *)((long)&poVar7->_vptr_basic_ostream + 4)) {
          if (((int)uVar14 < 0) ||
             (pcVar4 = (pSVar2->edge_sites_).
                       super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (*(uint *)&pcVar4[(int)*(uint *)&poVar7->_vptr_basic_ostream].
                        super_compact_array_base<int,_std::allocator<int>_> & 0xffffff) <
             (*(uint *)&pcVar4[uVar14].super_compact_array_base<int,_std::allocator<int>_> &
             0xffffff))) {
            uVar14 = *(uint *)&poVar7->_vptr_basic_ostream;
          }
        }
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != iVar9);
    }
    this_00 = local_68;
    if ((int)uVar14 < 0) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                 ,0x684,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_80.end_,"Check failed: (best) >= (0) ",0x1c);
      abort();
    }
    pcVar4 = (pSVar2->edge_sites_).
             super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar4[uVar14].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
      paVar13 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                pcVar4[uVar14].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
    }
    else {
      paVar13 = &pcVar4[uVar14].super_compact_array_base<int,_std::allocator<int>_>.field_7;
    }
    uVar14 = *(uint *)&pcVar4[uVar14].super_compact_array_base<int,_std::allocator<int>_>;
    bVar5 = true;
    if ((uVar14 & 0xffffff) != 0) {
      uVar10 = 0;
      do {
        iVar6 = *(int *)((long)paVar13 + uVar10);
        if (((iVar6 != v2) && (iVar6 != v0)) && (iVar6 != v1)) {
          pSVar12 = (this->g_->vertices_->
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar6;
          S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_80,local_50,pSVar12);
          if ((local_38.length2_ < (double)CONCAT44(local_80.begin_._4_4_,(VertexId)local_80.begin_)
              ) && ((double)CONCAT44(local_80.begin_._4_4_,(VertexId)local_80.begin_) <
                    local_40.length2_)) {
            if (v1 == v0) {
              iVar6 = s2pred::Sign(local_58,local_60,pSVar12);
              bVar5 = 0 < iVar6;
            }
            else {
              bVar5 = s2pred::OrderedCCW(local_50,local_60,pSVar12,local_58);
            }
            bVar5 = S2PolylineSimplifier::AvoidDisc
                              (this_00,pSVar12,
                               (S1ChordAngle)(this->builder_->min_edge_site_separation_ca_).length2_
                               ,bVar5);
            if (!bVar5) goto LAB_001ad574;
          }
        }
        uVar10 = uVar10 + 4;
      } while ((uVar14 & 0xffffff) << 2 != uVar10);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool S2Builder::EdgeChainSimplifier::AvoidSites(
    VertexId v0, VertexId v1, VertexId v2,
    S2PolylineSimplifier* simplifier) const {
  const S2Point& p0 = g_.vertex(v0);
  const S2Point& p1 = g_.vertex(v1);
  const S2Point& p2 = g_.vertex(v2);
  S1ChordAngle r1(p0, p1);
  S1ChordAngle r2(p0, p2);

  // The distance from the start of the edge chain must increase monotonically
  // for each vertex, since we don't want to simplify chains that backtrack on
  // themselves (we want a parametric approximation, not a geometric one).
  if (r2 < r1) return false;

  // We also limit the maximum edge length in order to guarantee that the
  // simplified edge stays with max_edge_deviation() of all the input edges
  // that snap to it.
  if (r2 >= builder_.min_edge_length_to_split_ca_) return false;

  // Otherwise it is sufficient to consider the nearby sites (edge_sites_) for
  // a single input edge that snapped to (v1, v2) or (v2, v1).  This is
  // because each edge has a list of all sites within (max_edge_deviation +
  // min_edge_vertex_separation), and since the output edge is within
  // max_edge_deviation of all input edges, this list includes all sites
  // within min_edge_vertex_separation of the output edge.
  //
  // Usually there is only one edge to choose from, but it's not much more
  // effort to choose the edge with the shortest list of edge_sites_.
  InputEdgeId best = -1;
  const auto& edge_sites = builder_.edge_sites_;
  for (EdgeId e : out_.edge_ids(v1, v2)) {
    for (InputEdgeId id : g_.input_edge_ids(e)) {
      if (best < 0 || edge_sites[id].size() < edge_sites[best].size())
        best = id;
    }
  }
  for (EdgeId e : out_.edge_ids(v2, v1)) {
    for (InputEdgeId id : g_.input_edge_ids(e)) {
      if (best < 0 || edge_sites[id].size() < edge_sites[best].size())
        best = id;
    }
  }
  S2_DCHECK_GE(best, 0);  // Because there is at least one outgoing edge.

  for (VertexId v : edge_sites[best]) {
    // This test is optional since these sites are excluded below anyway.
    if (v == v0 || v == v1 || v == v2) continue;

    // We are only interested in sites whose distance from "p0" is in the
    // range (r1, r2).  Sites closer than "r1" have already been processed,
    // and sites further than "r2" aren't relevant yet.
    const S2Point& p = g_.vertex(v);
    S1ChordAngle r(p0, p);
    if (r <= r1 || r >= r2) continue;

    // We need to figure out whether this site is to the left or right of the
    // edge chain.  For the first edge this is easy.  Otherwise, since we are
    // only considering sites in the radius range (r1, r2), we can do this by
    // checking whether the site is to the left of the wedge (p0, p1, p2).
    bool disc_on_left = (v1 == v0) ? (s2pred::Sign(p1, p2, p) > 0)
                                   : s2pred::OrderedCCW(p0, p2, p, p1);
    if (!simplifier->AvoidDisc(p, builder_.min_edge_site_separation_ca_,
                               disc_on_left)) {
      return false;
    }
  }
  return true;
}